

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# livevar_analyse.hpp
# Opt level: O3

bool __thiscall optimization::livevar_analyse::Block_Live_Var::build(Block_Live_Var *this)

{
  size_t sVar1;
  _Base_ptr p_Var2;
  long lVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  sharedPtrVariableSet *psVar5;
  bool bVar6;
  long lVar7;
  int idx;
  sharedPtrVariableSet *psVar8;
  element_type live_vars_out_before;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  jump_use_vars;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_80;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_50;
  
  if (2 < (this->subsequents)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    __assert_fail("subsequents.size() <= 2 && subsequents.size() >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/livevar_analyse.hpp"
                  ,0x8a,"bool optimization::livevar_analyse::Block_Live_Var::build()");
  }
  std::
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  ::_Rb_tree(&local_80,
             &((this->live_vars_out_ignoring_jump).
               super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->_M_t);
  std::
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  ::clear(&((this->live_vars_out_ignoring_jump).
            super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr)->_M_t);
  sVar1 = (this->subsequents)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 == 1) {
    lVar3 = *(long *)((this->subsequents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1);
    std::
    _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<mir::inst::VarId>>
              ((_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                *)(this->live_vars_out_ignoring_jump).
                  super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,*(_Base_ptr *)(lVar3 + 0x18),(_Base_ptr)(lVar3 + 8));
  }
  else if (sVar1 == 2) {
    p_Var2 = (this->subsequents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    lVar7 = std::_Rb_tree_decrement
                      (&(this->subsequents)._M_t._M_impl.super__Rb_tree_header._M_header);
    lVar3 = *(long *)(p_Var2 + 1);
    peVar4 = (this->live_vars_out_ignoring_jump).
             super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    std::
    __set_union<std::_Rb_tree_const_iterator<mir::inst::VarId>,std::_Rb_tree_const_iterator<mir::inst::VarId>,std::insert_iterator<std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (*(undefined8 *)(lVar3 + 0x18),lVar3 + 8,
               *(undefined8 *)(*(long *)(lVar7 + 0x20) + 0x18),*(long *)(lVar7 + 0x20) + 8,peVar4,
               (peVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  if ((this->first_build == false) &&
     (peVar4 = (this->live_vars_out_ignoring_jump).
               super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,
     (peVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count ==
     local_80._M_impl.super__Rb_tree_header._M_node_count)) {
    bVar6 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<mir::inst::VarId>,std::_Rb_tree_const_iterator<mir::inst::VarId>>
                      ((peVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<mir::inst::VarId>)
                       &(peVar4->_M_t)._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<mir::inst::VarId>)
                       local_80._M_impl.super__Rb_tree_header._M_header._M_left);
    if (bVar6) {
      bVar6 = false;
      goto LAB_00121745;
    }
  }
  mir::inst::JumpInstruction::useVars
            ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)&local_50,&this->block->jump);
  std::
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  ::clear(&((this->live_vars_out).
            super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr)->_M_t);
  peVar4 = (this->live_vars_out_ignoring_jump).
           super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::
  _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<mir::inst::VarId>>
            ((_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
              *)(this->live_vars_out).
                super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr,(peVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<mir::inst::VarId>)
             &(peVar4->_M_t)._M_impl.super__Rb_tree_header);
  std::
  _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<mir::inst::VarId>>
            ((_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
              *)(this->live_vars_out).
                super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr,
             (_Rb_tree_const_iterator<mir::inst::VarId>)
             local_50._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<mir::inst::VarId>)&local_50._M_impl.super__Rb_tree_header);
  this_00 = (this->live_vars_out).
            super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  idx = (int)((ulong)((long)(this->instLiveVars).
                            super__Vector_base<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->instLiveVars).
                           super__Vector_base<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4);
  while (idx = idx + -1, -1 < idx) {
    update(this,idx);
  }
  std::
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  ::clear(&((this->live_vars_in).
            super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr)->_M_t);
  psVar5 = (this->instLiveVars).
           super__Vector_base<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar8 = &this->live_vars_out;
  if ((this->instLiveVars).
      super__Vector_base<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar5) {
    psVar8 = psVar5;
  }
  peVar4 = (psVar8->
           super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  std::
  _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<mir::inst::VarId>>
            ((_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
              *)(this->live_vars_in).
                super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr,(peVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<mir::inst::VarId>)
             &(peVar4->_M_t)._M_impl.super__Rb_tree_header);
  this->first_build = false;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  ::~_Rb_tree(&local_50);
  bVar6 = true;
LAB_00121745:
  std::
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  ::~_Rb_tree(&local_80);
  return bVar6;
}

Assistant:

bool build() {
    assert(subsequents.size() <= 2 && subsequents.size() >= 0);
    auto live_vars_out_before = *live_vars_out_ignoring_jump;
    live_vars_out_ignoring_jump->clear();

    if (subsequents.size() == 2) {
      auto first = subsequents.begin();
      auto second = subsequents.end();
      second--;
      std::set_union(first->get()->begin(), first->get()->end(),
                     second->get()->begin(), second->get()->end(),
                     std::inserter(*(live_vars_out_ignoring_jump),
                                   this->live_vars_out_ignoring_jump->begin()));
    } else if (subsequents.size() == 1) {
      auto iter = subsequents.begin();
      live_vars_out_ignoring_jump->insert(iter->get()->begin(),
                                          iter->get()->end());
    }
    // LOG(TRACE) << live_vars_out_before.size() << "  " <<
    // live_vars_out->size()
    //           << std::endl;
    if (!first_build &&
        *live_vars_out_ignoring_jump ==
            live_vars_out_before) {  // if live_vars out dont't change, then
                                     // the block will not be modified
      return false;
    }
    auto jump_use_vars = block.jump.useVars();
    live_vars_out->clear();
    live_vars_out->insert(live_vars_out_ignoring_jump->begin(),
                          live_vars_out_ignoring_jump->end());
    live_vars_out->insert(jump_use_vars.begin(), jump_use_vars.end());
    auto tmp = live_vars_out;
    for (int i = instLiveVars.size() - 1; i >= 0; --i) {
      update(i);
    }
    live_vars_in->clear();
    if (instLiveVars.size()) {
      live_vars_in->insert(instLiveVars[0]->begin(), instLiveVars[0]->end());
    } else {  // Maybe the block's codes are all dead
      live_vars_in->insert(live_vars_out->begin(), live_vars_out->end());
    }
    first_build = false;
    return true;
  }